

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get_value<std::array<unsigned_int,4ul>>
          (Attribute *this,array<unsigned_int,_4UL> *v)

{
  undefined8 uVar1;
  value_type *pvVar2;
  optional<std::array<unsigned_int,_4UL>_> ret;
  optional<std::array<unsigned_int,_4UL>_> local_40;
  optional<std::array<unsigned_int,_4UL>_> local_2c;
  
  if (v == (array<unsigned_int,_4UL> *)0x0) {
    local_40.has_value_ = false;
  }
  else {
    primvar::PrimVar::get_value<std::array<unsigned_int,4ul>>(&local_40,&this->_var);
    local_2c.has_value_ = local_40.has_value_;
    if (local_40.has_value_ != false) {
      local_2c.contained._0_8_ = local_40.contained._0_8_;
      local_2c.contained._8_8_ = local_40.contained._8_8_;
      pvVar2 = nonstd::optional_lite::optional<std::array<unsigned_int,_4UL>_>::value(&local_2c);
      uVar1 = *(undefined8 *)(pvVar2->_M_elems + 2);
      *(undefined8 *)v->_M_elems = *(undefined8 *)pvVar2->_M_elems;
      *(undefined8 *)(v->_M_elems + 2) = uVar1;
    }
  }
  return local_40.has_value_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }